

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScalePlaneVertical_16
               (int src_height,int dst_width,int dst_height,int src_stride,int dst_stride,
               uint16_t *src_argb,uint16_t *dst_argb,int x,int y,int dy,int wpp,FilterMode filtering
               )

{
  int iVar1;
  uint16_t *dst_ptr;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  long in_R9;
  int yf;
  int yi;
  int j;
  int max_y;
  _func_void_uint16_t_ptr_uint16_t_ptr_ptrdiff_t_int_int *InterpolateRow;
  int in_stack_00000020;
  int dst_width_words;
  int local_44;
  int source_y_fraction;
  code *src_stride_00;
  undefined4 in_stack_ffffffffffffffd8;
  
  iVar1 = in_ESI * (int)src_argb;
  src_stride_00 = InterpolateRow_16_C;
  if (in_EDI < 2) {
    local_44 = 0;
  }
  else {
    local_44 = (in_EDI + -1) * 0x10000 + -1;
  }
  dst_ptr = (uint16_t *)(in_R9 + (long)((j >> 0x10) * (int)src_argb) * 2);
  for (source_y_fraction = 0; source_y_fraction < in_EDX; source_y_fraction = source_y_fraction + 1)
  {
    if (local_44 < (int)InterpolateRow) {
      InterpolateRow._0_4_ = local_44;
    }
    InterpolateRow_16_C(dst_ptr,(uint16_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
                        (ptrdiff_t)src_stride_00,local_44,source_y_fraction);
    InterpolateRow._0_4_ = in_stack_00000020 + (int)InterpolateRow;
  }
  return;
}

Assistant:

void ScalePlaneVertical_16(int src_height,
                           int dst_width,
                           int dst_height,
                           int src_stride,
                           int dst_stride,
                           const uint16_t* src_argb,
                           uint16_t* dst_argb,
                           int x,
                           int y,
                           int dy,
                           int wpp,
                           enum FilterMode filtering) {
  // TODO(fbarchard): Allow higher wpp.
  int dst_width_words = dst_width * wpp;
  void (*InterpolateRow)(uint16_t * dst_argb, const uint16_t* src_argb,
                         ptrdiff_t src_stride, int dst_width,
                         int source_y_fraction) = InterpolateRow_16_C;
  const int max_y = (src_height > 1) ? ((src_height - 1) << 16) - 1 : 0;
  int j;
  assert(wpp >= 1 && wpp <= 2);
  assert(src_height != 0);
  assert(dst_width > 0);
  assert(dst_height > 0);
  src_argb += (x >> 16) * wpp;
#if defined(HAS_INTERPOLATEROW_16_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    InterpolateRow = InterpolateRow_Any_16_SSE2;
    if (IS_ALIGNED(dst_width_bytes, 16)) {
      InterpolateRow = InterpolateRow_16_SSE2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_16_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    InterpolateRow = InterpolateRow_Any_16_SSSE3;
    if (IS_ALIGNED(dst_width_bytes, 16)) {
      InterpolateRow = InterpolateRow_16_SSSE3;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_16_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    InterpolateRow = InterpolateRow_Any_16_AVX2;
    if (IS_ALIGNED(dst_width_bytes, 32)) {
      InterpolateRow = InterpolateRow_16_AVX2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_16_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    InterpolateRow = InterpolateRow_Any_16_NEON;
    if (IS_ALIGNED(dst_width_bytes, 16)) {
      InterpolateRow = InterpolateRow_16_NEON;
    }
  }
#endif
  for (j = 0; j < dst_height; ++j) {
    int yi;
    int yf;
    if (y > max_y) {
      y = max_y;
    }
    yi = y >> 16;
    yf = filtering ? ((y >> 8) & 255) : 0;
    InterpolateRow(dst_argb, src_argb + yi * src_stride, src_stride,
                   dst_width_words, yf);
    dst_argb += dst_stride;
    y += dy;
  }
}